

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall
QFileDialogPrivate::itemNotFound(QFileDialogPrivate *this,QString *fileName,FileMode mode)

{
  QWidget *this_00;
  int iVar1;
  long in_FS_OFFSET;
  QAnyStringView QVar2;
  QString local_78;
  QString local_60;
  QArrayData *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  iVar1 = 0x6f4b29;
  if (mode == Directory) {
    iVar1 = 0x6f4add;
  }
  QMetaObject::tr((char *)&local_48,(char *)&QFileDialog::staticMetaObject,iVar1);
  QWidget::windowTitle(&local_60,this_00);
  QVar2.m_size = (size_t)&local_48;
  QVar2.field_0.m_data = &local_78;
  QString::arg_impl(QVar2,(int)(fileName->d).ptr,(QChar)(char16_t)(fileName->d).size);
  QMessageBox::warning(this_00,&local_60,&local_78,(StandardButtons)0x400,NoButton);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::itemNotFound(const QString &fileName, QFileDialog::FileMode mode)
{
#if QT_CONFIG(messagebox)
    Q_Q(QFileDialog);
    const QString message = mode == QFileDialog::Directory
            ? QFileDialog::tr("%1\nDirectory not found.\n"
                              "Please verify the correct directory name was given.")
            : QFileDialog::tr("%1\nFile not found.\nPlease verify the "
                              "correct file name was given.");

    QMessageBox::warning(q, q->windowTitle(), message.arg(fileName));
#endif // QT_CONFIG(messagebox)
}